

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_max_gap(REF_GRID ref_grid,REF_DBL *max_gap)

{
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  REF_DBL *pRVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  REF_MPI pRVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  REF_DBL max;
  REF_DBL global_max;
  REF_DBL xyz [3];
  double local_70;
  REF_MPI local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double *local_38;
  
  pRVar6 = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  ref_geom = ref_grid->geom;
  *max_gap = 0.0;
  uVar3 = 0;
  if (ref_geom->model != (void *)0x0) {
    local_70 = 0.0;
    local_68 = pRVar6;
    local_38 = max_gap;
    if (0 < ref_geom->max) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        if ((*(int *)((long)ref_geom->descr + lVar7) == 0) &&
           (lVar5 = (long)*(int *)((long)ref_geom->descr + lVar7 + 0x14),
           pRVar6->id == pRVar1->part[lVar5])) {
          uVar3 = ref_egads_eval(ref_geom,(REF_INT)lVar8,&local_58,(REF_DBL *)0x0);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x727,"ref_geom_max_gap",(ulong)uVar3,"eval xyz");
            return uVar3;
          }
          pRVar2 = pRVar1->real;
          dVar9 = (local_48 - pRVar2[lVar5 * 0xf + 2]) * (local_48 - pRVar2[lVar5 * 0xf + 2]) +
                  (local_50 - pRVar2[lVar5 * 0xf + 1]) * (local_50 - pRVar2[lVar5 * 0xf + 1]) +
                  (local_58 - pRVar2[lVar5 * 0xf]) * (local_58 - pRVar2[lVar5 * 0xf]);
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          pRVar6 = local_68;
          if (local_70 <= dVar9) {
            local_70 = dVar9;
          }
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x18;
      } while (lVar8 < ref_geom->max);
    }
    uVar3 = ref_mpi_max(pRVar6,&local_70,&local_60,3);
    if (uVar3 == 0) {
      dVar9 = *local_38;
      if (*local_38 <= local_60) {
        dVar9 = local_60;
      }
      *local_38 = dVar9;
      local_70 = 0.0;
      pRVar6 = local_68;
      if (0 < ref_geom->max) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          if ((*(int *)((long)ref_geom->descr + lVar7) == 1) &&
             (lVar5 = (long)*(int *)((long)ref_geom->descr + lVar7 + 0x14),
             pRVar6->id == pRVar1->part[lVar5])) {
            uVar3 = ref_egads_eval(ref_geom,(REF_INT)lVar8,&local_58,(REF_DBL *)0x0);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x735,"ref_geom_max_gap",(ulong)uVar3,"eval xyz");
              return uVar3;
            }
            pRVar2 = pRVar1->real;
            dVar9 = (local_48 - pRVar2[lVar5 * 0xf + 2]) * (local_48 - pRVar2[lVar5 * 0xf + 2]) +
                    (local_50 - pRVar2[lVar5 * 0xf + 1]) * (local_50 - pRVar2[lVar5 * 0xf + 1]) +
                    (local_58 - pRVar2[lVar5 * 0xf]) * (local_58 - pRVar2[lVar5 * 0xf]);
            if (dVar9 < 0.0) {
              dVar9 = sqrt(dVar9);
            }
            else {
              dVar9 = SQRT(dVar9);
            }
            pRVar6 = local_68;
            if (local_70 <= dVar9) {
              local_70 = dVar9;
            }
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x18;
        } while (lVar8 < ref_geom->max);
      }
      uVar3 = ref_mpi_max(pRVar6,&local_70,&local_60,3);
      if (uVar3 == 0) {
        dVar9 = *local_38;
        if (*local_38 <= local_60) {
          dVar9 = local_60;
        }
        *local_38 = dVar9;
        local_70 = 0.0;
        pRVar6 = local_68;
        if (0 < ref_geom->max) {
          lVar7 = 0;
          lVar8 = 0;
          do {
            if ((*(int *)((long)ref_geom->descr + lVar7) == 2) &&
               (lVar5 = (long)*(int *)((long)ref_geom->descr + lVar7 + 0x14),
               pRVar6->id == pRVar1->part[lVar5])) {
              uVar3 = ref_egads_eval(ref_geom,(REF_INT)lVar8,&local_58,(REF_DBL *)0x0);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x743,"ref_geom_max_gap",(ulong)uVar3,"eval xyz");
                return uVar3;
              }
              pRVar2 = pRVar1->real;
              dVar9 = (local_48 - pRVar2[lVar5 * 0xf + 2]) * (local_48 - pRVar2[lVar5 * 0xf + 2]) +
                      (local_50 - pRVar2[lVar5 * 0xf + 1]) * (local_50 - pRVar2[lVar5 * 0xf + 1]) +
                      (local_58 - pRVar2[lVar5 * 0xf]) * (local_58 - pRVar2[lVar5 * 0xf]);
              if (dVar9 < 0.0) {
                dVar9 = sqrt(dVar9);
              }
              else {
                dVar9 = SQRT(dVar9);
              }
              pRVar6 = local_68;
              if (local_70 <= dVar9) {
                local_70 = dVar9;
              }
            }
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + 0x18;
          } while (lVar8 < ref_geom->max);
        }
        uVar3 = ref_mpi_max(pRVar6,&local_70,&local_60,3);
        if (uVar3 == 0) {
          local_70 = local_60;
          dVar9 = *local_38;
          if (*local_38 <= local_60) {
            dVar9 = local_60;
          }
          *local_38 = dVar9;
          uVar4 = ref_mpi_bcast(local_68,local_38,1,3);
          uVar3 = 0;
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x74c,"ref_geom_max_gap",(ulong)uVar4,"mpi bcast gap");
            uVar3 = uVar4;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x749,"ref_geom_max_gap",(ulong)uVar3,"mpi max face");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x73b,"ref_geom_max_gap",(ulong)uVar3,"mpi max edge");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x72d,
             "ref_geom_max_gap",(ulong)uVar3,"mpi max node");
    }
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_max_gap(REF_GRID ref_grid, REF_DBL *max_gap) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom;
  REF_INT node;
  REF_DBL xyz[3];
  REF_DBL dist, max, global_max;

  *max_gap = 0.0;

  if (!ref_geom_model_loaded(ref_geom)) return REF_SUCCESS;

  max = 0.0;
  each_ref_geom_node(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max node");
  max = global_max;
  *max_gap = MAX(*max_gap, max);

  max = 0.0;
  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max edge");
  max = global_max;
  *max_gap = MAX(*max_gap, max);

  max = 0.0;
  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max face");
  max = global_max;
  *max_gap = MAX(*max_gap, max);
  RSS(ref_mpi_bcast(ref_mpi, max_gap, 1, REF_DBL_TYPE), "mpi bcast gap");

  return REF_SUCCESS;
}